

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

appender fmt::v8::detail::write_significand<fmt::v8::appender,char>
                   (appender out,char *significand,int significand_size,int integral_size,
                   char decimal_point)

{
  back_insert_iterator<fmt::v8::detail::buffer<char>_> out_00;
  char local_29;
  
  local_29 = decimal_point;
  out_00.container =
       (buffer<char> *)
       copy_str_noinline<char,char_const*,fmt::v8::appender>
                 (significand,significand + integral_size,out);
  if (decimal_point != '\0') {
    buffer<char>::push_back(out_00.container,&local_29);
    out_00.container =
         (buffer<char> *)
         copy_str_noinline<char,char_const*,fmt::v8::appender>
                   (significand + integral_size,significand + significand_size,
                    (appender)out_00.container);
  }
  return (appender)(back_insert_iterator<fmt::v8::detail::buffer<char>_>)out_00.container;
}

Assistant:

FMT_CONSTEXPR auto write_significand(OutputIt out, const char* significand,
                                     int significand_size, int integral_size,
                                     Char decimal_point) -> OutputIt {
  out = detail::copy_str_noinline<Char>(significand,
                                        significand + integral_size, out);
  if (!decimal_point) return out;
  *out++ = decimal_point;
  return detail::copy_str_noinline<Char>(significand + integral_size,
                                         significand + significand_size, out);
}